

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

ReflectionPayload * __thiscall
google::protobuf::internal::MapFieldBase::PayloadSlow(MapFieldBase *this)

{
  undefined1 *__i;
  bool bVar1;
  ReflectionPayload *pRVar2;
  TaggedPtr p;
  Arena *arena;
  
  p = (this->super_MapFieldBaseForParse).payload_._M_i;
  __i = (undefined1 *)p;
  if ((p & 1) == 0) {
    MapFieldBaseForParse::sync_map_with_repeated = PayloadSlow()::MapFieldBaseForParse_const__bool_;
    arena = ToArena(p);
    pRVar2 = Arena::
             Create<google::protobuf::internal::MapFieldBase::ReflectionPayload,google::protobuf::Arena*&>
                       (arena,&arena);
    __i = (undefined1 *)
          ((long)&(pRVar2->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ + 1);
    bVar1 = std::atomic<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr>::
            compare_exchange_strong
                      ((atomic<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr> *)this,
                       &p,(TaggedPtr)__i,memory_order_acq_rel);
    if ((!bVar1) && (__i = (undefined1 *)p, arena == (Arena *)0x0)) {
      if (pRVar2 != (ReflectionPayload *)0x0) {
        ReflectionPayload::~ReflectionPayload(pRVar2);
      }
      operator_delete(pRVar2,0x28);
      __i = (undefined1 *)p;
    }
  }
  p = (TaggedPtr)__i;
  pRVar2 = ToPayload(p);
  return pRVar2;
}

Assistant:

MapFieldBase::ReflectionPayload& MapFieldBase::PayloadSlow() const {
  auto p = payload_.load(std::memory_order_acquire);
  if (!IsPayload(p)) {
    // Inject the sync callback.
    sync_map_with_repeated.store(
        [](auto& map, bool is_mutable) {
          const auto& self = static_cast<const MapFieldBase&>(map);
          self.SyncMapWithRepeatedField();
          if (is_mutable) const_cast<MapFieldBase&>(self).SetMapDirty();
        },
        std::memory_order_relaxed);

    auto* arena = ToArena(p);
    auto* payload = Arena::Create<ReflectionPayload>(arena, arena);

    auto new_p = ToTaggedPtr(payload);
    if (payload_.compare_exchange_strong(p, new_p, std::memory_order_acq_rel)) {
      // We were able to store it.
      p = new_p;
    } else {
      // Someone beat us to it. Throw away the one we made. `p` already contains
      // the one we want.
      if (arena == nullptr) delete payload;
    }
  }
  return *ToPayload(p);
}